

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

int __thiscall QMetaObjectBuilder::indexOfProperty(QMetaObjectBuilder *this,QByteArray *name)

{
  pointer pQVar1;
  bool bVar2;
  pointer pQVar3;
  long lVar4;
  
  pQVar3 = (this->d->properties).
           super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar1 = (this->d->properties).
           super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pQVar3 != pQVar1) {
    lVar4 = -(long)pQVar3;
    do {
      bVar2 = ::operator==(name,&pQVar3->name);
      if (bVar2) {
        pQVar3 = (this->d->properties).
                 super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pQVar3 != (this->d->properties).
                      super__Vector_base<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          return (int)((ulong)-((long)&(pQVar3->name).d.d + lVar4) >> 3) * 0x38e38e39;
        }
        indexOfProperty();
      }
      pQVar3 = pQVar3 + 1;
      lVar4 = lVar4 + -0x48;
    } while (pQVar3 != pQVar1);
  }
  return -1;
}

Assistant:

int QMetaObjectBuilder::indexOfProperty(const QByteArray &name)
{
    for (const auto &property : d->properties) {
        if (name == property.name)
            return int(&property - &d->properties.front());
    }
    return -1;
}